

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall SubprocessTestTokenAvailable::Run(SubprocessTestTokenAvailable *this)

{
  undefined *__s;
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  ExitStatus EVar4;
  Subprocess *pSVar5;
  ssize_t sVar6;
  size_type sVar7;
  string *__rhs;
  undefined1 local_55;
  int local_54;
  int iStack_50;
  char token;
  int fds [2];
  allocator<char> local_39;
  string local_38;
  Subprocess *local_18;
  Subprocess *subproc;
  SubprocessTestTokenAvailable *this_local;
  
  __s = (anonymous_namespace)::kSimpleCommand;
  subproc = (Subprocess *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  pSVar5 = SubprocessSet::Add(&(this->super_SubprocessTest).subprocs_,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = pSVar5;
  bVar2 = testing::Test::Check
                    (g_current_test,pSVar5 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x135,"(Subprocess *) 0 != subproc");
  pTVar1 = g_current_test;
  if (bVar2) {
    iVar3 = pipe(&local_54);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar3 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0x13c,"0u == pipe(fds)");
    if (bVar2) {
      (this->super_SubprocessTest).tokens_._fd = local_54;
      pTVar1 = g_current_test;
      sVar6 = write(iStack_50,"T",1);
      bVar2 = testing::Test::Check
                        (pTVar1,sVar6 == 1,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                         ,0x13e,"1u == write(fds[1], \"T\", 1)");
      if (bVar2) {
        SubprocessSet::ResetTokenAvailable(&(this->super_SubprocessTest).subprocs_);
        SubprocessSet::DoWork
                  (&(this->super_SubprocessTest).subprocs_,
                   &(this->super_SubprocessTest).tokens_.super_TokenPool);
        pTVar1 = g_current_test;
        bVar2 = SubprocessSet::IsTokenAvailable(&(this->super_SubprocessTest).subprocs_);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                   ,0x14c,"subprocs_.IsTokenAvailable()");
        pTVar1 = g_current_test;
        sVar7 = std::queue<Subprocess_*,_std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>_>::
                size(&(this->super_SubprocessTest).subprocs_.finished_);
        testing::Test::Check
                  (pTVar1,sVar7 == 0,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                   ,0x14d,"0u == subprocs_.finished_.size()");
        pTVar1 = g_current_test;
        sVar6 = read(local_54,&local_55,1);
        bVar2 = testing::Test::Check
                          (pTVar1,sVar6 == 1,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                           ,0x152,"1u == read(fds[0], &token, 1)");
        if (bVar2) {
          while (bVar2 = Subprocess::Done(local_18), ((bVar2 ^ 0xffU) & 1) != 0) {
            SubprocessSet::DoWork
                      (&(this->super_SubprocessTest).subprocs_,
                       &(this->super_SubprocessTest).tokens_.super_TokenPool);
          }
          close(iStack_50);
          close(local_54);
          pTVar1 = g_current_test;
          EVar4 = Subprocess::Finish(local_18);
          testing::Test::Check
                    (pTVar1,EVar4 == ExitSuccess,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x15e,"ExitSuccess == subproc->Finish()");
          pTVar1 = g_current_test;
          __rhs = Subprocess::GetOutput_abi_cxx11_(local_18);
          bVar2 = std::operator!=("",__rhs);
          testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x15f,"\"\" != subproc->GetOutput()");
          pTVar1 = g_current_test;
          sVar7 = std::queue<Subprocess_*,_std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>_>
                  ::size(&(this->super_SubprocessTest).subprocs_.finished_);
          testing::Test::Check
                    (pTVar1,sVar7 == 1,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x161,"1u == subprocs_.finished_.size()");
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, TokenAvailable) {
  Subprocess* subproc = subprocs_.Add(kSimpleCommand);
  ASSERT_NE((Subprocess *) 0, subproc);

  // simulate GNUmake jobserver pipe with 1 token
#ifdef _WIN32
  tokens_._token_available = true;
#else
  int fds[2];
  ASSERT_EQ(0u, pipe(fds));
  tokens_._fd = fds[0];
  ASSERT_EQ(1u, write(fds[1], "T", 1));
#endif

  subprocs_.ResetTokenAvailable();
  subprocs_.DoWork(&tokens_);
#ifdef _WIN32
  tokens_._token_available = false;
  // we need to loop here as we have no conrol where the token
  // I/O completion post ends up in the queue
  while (!subproc->Done() && !subprocs_.IsTokenAvailable()) {
    subprocs_.DoWork(&tokens_);
  }
#endif

  EXPECT_TRUE(subprocs_.IsTokenAvailable());
  EXPECT_EQ(0u, subprocs_.finished_.size());

  // remove token to let DoWork() wait for command again
#ifndef _WIN32
  char token;
  ASSERT_EQ(1u, read(fds[0], &token, 1));
#endif

  while (!subproc->Done()) {
    subprocs_.DoWork(&tokens_);
  }

#ifndef _WIN32
  close(fds[1]);
  close(fds[0]);
#endif

  EXPECT_EQ(ExitSuccess, subproc->Finish());
  EXPECT_NE("", subproc->GetOutput());

  EXPECT_EQ(1u, subprocs_.finished_.size());
}